

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_ForceField(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  AActor *this;
  TAngle<double> local_40;
  TAngle<double> local_38;
  FName local_2c;
  int local_28;
  int local_24;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if (it != (AActor *)0x0) {
    local_28 = arg2;
    local_24 = arg1;
    arg2_local = arg0;
    arg1_local._3_1_ = backSide;
    _arg0_local = it;
    it_local = (AActor *)ln;
    FName::FName(&local_2c,NAME_None);
    TAngle<double>::TAngle(&local_38,0.0);
    P_DamageMobj(it,(AActor *)0x0,(AActor *)0x0,0x10,&local_2c,0,&local_38);
    this = _arg0_local;
    TAngle<double>::operator+(&local_40,180.0);
    AActor::Thrust(this,&local_40,7.8125);
  }
  return 1;
}

Assistant:

FUNC(LS_ForceField)
// ForceField ()
{
	if (it != NULL)
	{
		P_DamageMobj (it, NULL, NULL, 16, NAME_None);
		it->Thrust(it->Angles.Yaw + 180, 7.8125);
	}
	return true;
}